

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264StreamReader.cpp
# Opt level: O2

int __thiscall H264StreamReader::processSPS(H264StreamReader *this,uint8_t *buff)

{
  map<unsigned_int,_SPSUnit_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_SPSUnit_*>_>_>
  *this_00;
  bool bVar1;
  byte bVar2;
  uint uVar3;
  SPSUnit *this_01;
  int iVar4;
  iterator iVar5;
  SPSUnit *this_02;
  uint8_t *puVar6;
  iterator iVar7;
  ostream *poVar8;
  mapped_type *ppSVar9;
  bool bVar10;
  uint *__k;
  double sar;
  string local_50;
  
  if (this->m_needSeiCorrection == true) {
    puVar6 = (this->super_MPEGStreamReader).super_AbstractStreamReader.m_bufEnd;
    if ((long)puVar6 - (long)buff < 8) {
      return -10;
    }
    local_50._M_dataplus._M_p._0_4_ = NALUnit::extractUEGolombCode(buff + 4,puVar6);
    iVar5 = std::
            _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
            ::find(&(this->updatedSPSList)._M_t,(key_type_conflict1 *)&local_50);
    if ((_Rb_tree_header *)iVar5._M_node !=
        &(this->updatedSPSList)._M_t._M_impl.super__Rb_tree_header) {
      return 0;
    }
  }
  this_02 = (SPSUnit *)operator_new(0x200);
  SPSUnit::SPSUnit(this_02);
  puVar6 = NALUnit::findNALWithStartCode
                     (buff,(this->super_MPEGStreamReader).super_AbstractStreamReader.m_bufEnd,true);
  NALUnit::decodeBuffer((NALUnit *)this_02,buff,puVar6);
  iVar4 = SPSUnit::deserialize(this_02);
  bVar1 = (this_02->nalHrdParams).isPresent;
  if (this->orig_hrd_parameters_present_flag == bVar1) {
    bVar10 = (this_02->vclHrdParams).isPresent;
    if (this->orig_vcl_parameters_present_flag == bVar10) goto LAB_0019a5be;
  }
  else {
    bVar10 = (this_02->vclHrdParams).isPresent;
  }
  this->orig_hrd_parameters_present_flag = bVar1;
  this->orig_vcl_parameters_present_flag = bVar10;
  if (this->m_spsChangeWarned == false) {
    poVar8 = std::operator<<((ostream *)&std::cerr,
                             "H264 warn: SPS parameters is not consistent throughout a stream");
    std::endl<char,std::char_traits<char>>(poVar8);
    sLastMsg = true;
    this->m_spsChangeWarned = true;
  }
LAB_0019a5be:
  if (iVar4 == 0) {
    this_00 = &this->m_spsMap;
    __k = &this_02->seq_parameter_set_id;
    iVar7 = std::
            _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_SPSUnit_*>,_std::_Select1st<std::pair<const_unsigned_int,_SPSUnit_*>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_SPSUnit_*>_>_>
            ::find(&this_00->_M_t,__k);
    if ((_Rb_tree_header *)iVar7._M_node == &(this->m_spsMap)._M_t._M_impl.super__Rb_tree_header) {
      poVar8 = std::operator<<((ostream *)&std::cout,"Decoding H264 stream (track ");
      poVar8 = (ostream *)
               std::ostream::operator<<
                         (poVar8,(this->super_MPEGStreamReader).super_AbstractStreamReader.
                                 m_streamIndex);
      poVar8 = std::operator<<(poVar8,"): ");
      SPSUnit::getStreamDescr_abi_cxx11_(&local_50,this_02);
      poVar8 = std::operator<<(poVar8,(string *)&local_50);
      std::endl<char,std::char_traits<char>>(poVar8);
      std::__cxx11::string::~string((string *)&local_50);
      sLastMsg = true;
      if (this->m_forcedLevel != '\0') {
        std::operator<<((ostream *)&std::cout,"Change H264 level from ");
        poVar8 = std::ostream::_M_insert<double>((double)this_02->level_idc / 10.0);
        std::operator<<(poVar8," to ");
        poVar8 = std::ostream::_M_insert<double>((double)this->m_forcedLevel / 10.0);
        std::endl<char,std::char_traits<char>>(poVar8);
        sLastMsg = true;
      }
    }
    if ((this->m_forcedLevel != '\0') &&
       (3 < (long)(this->super_MPEGStreamReader).super_AbstractStreamReader.m_bufEnd - (long)buff))
    {
      buff[3] = this->m_forcedLevel;
      bVar2 = this->m_forcedLevel;
      (this_02->super_NALUnit).m_nalBuffer[3] = bVar2;
      this_02->level_idc = (uint)bVar2;
    }
    MPEGStreamReader::updateFPS
              (&this->super_MPEGStreamReader,this_02,buff,puVar6,(int)puVar6 - (int)buff);
    updateHRDParam(this,this_02);
    if ((this_02->nalHrdParams).isPresent == true) {
      std::
      _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
      ::_M_insert_unique<unsigned_int_const&>
                ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                  *)&this->updatedSPSList,__k);
    }
    ppSVar9 = std::
              map<unsigned_int,_SPSUnit_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_SPSUnit_*>_>_>
              ::operator[](this_00,__k);
    this_01 = *ppSVar9;
    if (this_01 != (SPSUnit *)0x0) {
      SPSUnit::~SPSUnit(this_01);
    }
    operator_delete(this_01,0x200);
    ppSVar9 = std::
              map<unsigned_int,_SPSUnit_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_SPSUnit_*>_>_>
              ::operator[](this_00,__k);
    *ppSVar9 = this_02;
    sar = 1.0;
    if (this_02->aspect_ratio_info_present_flag != 0) {
      bVar2 = this_02->aspect_ratio_idc;
      if ((byte)(bVar2 - 1) < 0x10) {
        sar = h264_ar_coeff[bVar2];
      }
      else if (bVar2 == 0xff) {
        uVar3._0_2_ = this_02->sar_width;
        uVar3._2_2_ = this_02->sar_height;
        sar = (double)(uVar3 & 0xffff) / (double)(uVar3 >> 0x10);
      }
    }
    MPEGStreamReader::fillAspectBySAR(&this->super_MPEGStreamReader,sar);
    iVar4 = 0;
  }
  else {
    SPSUnit::~SPSUnit(this_02);
    operator_delete(this_02,0x200);
  }
  return iVar4;
}

Assistant:

int H264StreamReader::processSPS(uint8_t *buff)
{
    if (replaceToOwnSPS())
    {
        // do not updat SPS in stream because of we are going to insert own sps
        if (m_bufEnd - buff < 8)
            return NOT_ENOUGH_BUFFER;
        const int seq_parameter_set_id = static_cast<int>(NALUnit::extractUEGolombCode(buff + 4, m_bufEnd));
        if (updatedSPSList.find(seq_parameter_set_id) != updatedSPSList.end())
            return 0;  // already processed
    }

    auto *sps = new SPSUnit();
    uint8_t *nextNal = NALUnit::findNALWithStartCode(buff, m_bufEnd, true);
    const int oldSpsLen = static_cast<int>(nextNal - buff);
    sps->decodeBuffer(buff, nextNal);
    const int nalRez = sps->deserialize();

    if (orig_hrd_parameters_present_flag != sps->nalHrdParams.isPresent ||
        orig_vcl_parameters_present_flag != sps->vclHrdParams.isPresent)
    {
        orig_hrd_parameters_present_flag = sps->nalHrdParams.isPresent;
        orig_vcl_parameters_present_flag = sps->vclHrdParams.isPresent;
        if (!m_spsChangeWarned)
        {
            LTRACE(LT_WARN, 2, "H264 warn: SPS parameters is not consistent throughout a stream");
            m_spsChangeWarned = true;
        }
    }

    // long sps fields can cause 00 00 0x code and it is required decode slice header
    if (nalRez != 0)
    {
        delete sps;
        return nalRez;  // not enough buffer
    }

    if (m_spsMap.find(sps->seq_parameter_set_id) == m_spsMap.end())
    {
        LTRACE(LT_INFO, 2, "Decoding H264 stream (track " << m_streamIndex << "): " << sps->getStreamDescr());
        if (m_forcedLevel != 0)
            LTRACE(LT_INFO, 2, "Change H264 level from " << sps->level_idc / 10.0 << " to " << m_forcedLevel / 10.0);
    }
    // update profile if needed
    if (m_forcedLevel != 0 && m_bufEnd - buff >= 4)
    {
        buff[3] = m_forcedLevel;
        sps->m_nalBuffer[3] = m_forcedLevel;
        sps->level_idc = m_forcedLevel;
    }

    updateFPS(sps, buff, nextNal, oldSpsLen);
    updateHRDParam(sps);
    if (sps->nalHrdParams.isPresent)
        updatedSPSList.insert(sps->seq_parameter_set_id);

    delete m_spsMap[sps->seq_parameter_set_id];
    m_spsMap[sps->seq_parameter_set_id] = sps;

    double sarAR = 1.0;
    if (sps->aspect_ratio_info_present_flag)
    {
        if (sps->aspect_ratio_idc >= 1 && sps->aspect_ratio_idc <= 16)
            sarAR = h264_ar_coeff[sps->aspect_ratio_idc];
        else if (sps->aspect_ratio_idc == Extended_SAR)
            sarAR = sps->sar_width / static_cast<double>(sps->sar_height);
    }
    fillAspectBySAR(sarAR);

    return 0;
}